

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write_decimal<long_long>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,longlong value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ptrdiff_t _Num;
  ulong __n;
  ulong uVar9;
  char *__dest;
  char buffer [40];
  undefined1 auStack_58 [40];
  
  uVar7 = -value;
  if (0 < value) {
    uVar7 = value;
  }
  lVar4 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar8 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __n = (ulong)((uVar8 - (uVar7 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                            (ulong)uVar8 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = (sVar2 - (value >> 0x3f)) + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar9);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar5 = auStack_58 + __n;
  uVar9 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar9 / 100;
      *(undefined2 *)(puVar5 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar9 + (int)uVar7 * -100) * 2);
      puVar5 = puVar5 + -2;
      bVar3 = 9999 < uVar9;
      uVar9 = uVar7;
    } while (bVar3);
  }
  if (uVar7 < 10) {
    bVar6 = (byte)uVar7 | 0x30;
    lVar4 = -1;
  }
  else {
    puVar5[-1] = basic_data<void>::digits[(uVar7 * 2 & 0xffffffff) + 1];
    bVar6 = basic_data<void>::digits[uVar7 * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  puVar5[lVar4] = bVar6;
  if (__n != 0) {
    memcpy(__dest,auStack_58,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }